

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__shiftsigned(uint v,int shift,int bits)

{
  uint uVar1;
  
  uVar1 = v >> ((byte)shift & 0x1f);
  if (shift < 0) {
    uVar1 = v << (-(byte)shift & 0x1f);
  }
  if (uVar1 < 0x100) {
    if (bits < 9) {
      return (int)((uVar1 >> (8U - (char)bits & 0x1f)) * stbi__shiftsigned::mul_table[(uint)bits])
             >> ((byte)stbi__shiftsigned::shift_table[(uint)bits] & 0x1f);
    }
    __assert_fail("bits >= 0 && bits <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                  ,0x13f8,"int stbi__shiftsigned(unsigned int, int, int)");
  }
  __assert_fail("v >= 0 && v < 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                ,0x13f6,"int stbi__shiftsigned(unsigned int, int, int)");
}

Assistant:

static int stbi__shiftsigned(unsigned int v, int shift, int bits)
{
   static unsigned int mul_table[9] = {
      0,
      0xff/*0b11111111*/, 0x55/*0b01010101*/, 0x49/*0b01001001*/, 0x11/*0b00010001*/,
      0x21/*0b00100001*/, 0x41/*0b01000001*/, 0x81/*0b10000001*/, 0x01/*0b00000001*/,
   };
   static unsigned int shift_table[9] = {
      0, 0,0,1,0,2,4,6,0,
   };
   if (shift < 0)
      v <<= -shift;
   else
      v >>= shift;
   STBI_ASSERT(v >= 0 && v < 256);
   v >>= (8-bits);
   STBI_ASSERT(bits >= 0 && bits <= 8);
   return (int) ((unsigned) v * mul_table[bits]) >> shift_table[bits];
}